

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputlexer.cpp
# Opt level: O0

yy_state_type yy_get_previous_state(void)

{
  byte local_19;
  byte *pbStack_18;
  YY_CHAR yy_c;
  char *yy_cp;
  yy_state_type yy_current_state;
  
  yy_cp._4_4_ = yy_buffer_stack[yy_buffer_stack_top]->yy_at_bol + yy_start;
  for (pbStack_18 = (byte *)iltext; pbStack_18 < yy_c_buf_p; pbStack_18 = pbStack_18 + 1) {
    if (*pbStack_18 == 0) {
      local_19 = 1;
    }
    else {
      local_19 = ""[*pbStack_18];
    }
    if (yy_accept[yy_cp._4_4_] != 0) {
      yy_last_accepting_state = yy_cp._4_4_;
      yy_last_accepting_cpos = (char *)pbStack_18;
    }
    while (yy_chk[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_19)] != yy_cp._4_4_) {
      yy_cp._4_4_ = (int)yy_def[yy_cp._4_4_];
      if (0x5f < yy_cp._4_4_) {
        local_19 = ""[local_19];
      }
    }
    yy_cp._4_4_ = (int)yy_nxt[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_19)];
  }
  return yy_cp._4_4_;
}

Assistant:

static yy_state_type yy_get_previous_state (void)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    
	yy_current_state = (yy_start);
	yy_current_state += YY_AT_BOL();

	for ( yy_cp = (yytext_ptr) + YY_MORE_ADJ; yy_cp < (yy_c_buf_p); ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			(yy_last_accepting_state) = yy_current_state;
			(yy_last_accepting_cpos) = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 43 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}